

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O3

void proto3::MapOutWireFormat_Map4Entry::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  Arena *pAVar2;
  Arena *extraout_RDX;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  string local_48;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    pAVar2 = extraout_RDX;
LAB_00d2ed31:
    pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
LAB_00d2ec89:
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,pAVar2);
  }
  else {
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 3) == 0) goto LAB_00d2ecf5;
    if ((unaff_EBP & 1) != 0) {
      value = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (value->_M_string_length != 0) {
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
        this = (MessageLite *)&to_msg[1]._internal_metadata_;
        pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar2 & 1) != 0) goto LAB_00d2ed31;
        goto LAB_00d2ec89;
      }
      if ((to_msg[1]._internal_metadata_.ptr_ & 3) == 0) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,anon_var_dwarf_a22956 + 5);
        *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
        pAVar2 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar2 & 1) != 0) {
          pAVar2 = *(Arena **)((ulong)pAVar2 & 0xfffffffffffffffe);
        }
        google::protobuf::internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,&local_48,pAVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (((unaff_EBP & 2) != 0) && (*(char *)&from_msg[2]._vptr_MessageLite == '\x01')) {
    *(undefined1 *)&to_msg[2]._vptr_MessageLite = 1;
  }
LAB_00d2ecf5:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

void MapOutWireFormat_Map4Entry::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<MapOutWireFormat_Map4Entry*>(&to_msg);
  auto& from = static_cast<const MapOutWireFormat_Map4Entry&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto3.MapOutWireFormat.Map4Entry)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_value().empty()) {
        _this->_internal_set_value(from._internal_value());
      } else {
        if (_this->_impl_.value_.IsDefault()) {
          _this->_internal_set_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (from._internal_key() != 0) {
        _this->_impl_.key_ = from._impl_.key_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}